

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cppjit.cpp
# Opt level: O0

void test_call_kernels::test_void(void)

{
  ostream *this;
  allocator local_29;
  string local_28 [32];
  
  this = std::operator<<((ostream *)&std::cout,"testing kernel with void arguments");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  cppjit::kernel<void,_cppjit::detail::pack<>_>::set_verbose
            ((kernel<void,_cppjit::detail::pack<>_> *)cppjit::void_kernel,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"extern \"C\" void void_kernel(void) {}",&local_29);
  cppjit::kernel<void,_cppjit::detail::pack<>_>::compile_inline
            ((kernel<void,_cppjit::detail::pack<>_> *)cppjit::void_kernel,(string *)local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cppjit::kernel<void,_cppjit::detail::pack<>_>::operator()
            ((kernel<void,_cppjit::detail::pack<>_> *)cppjit::void_kernel);
  return;
}

Assistant:

void test_void() {
  std::cout << "testing kernel with void arguments" << std::endl;
  cppjit::void_kernel.set_verbose(true);
  cppjit::void_kernel.compile_inline("extern \"C\" void "
                                     "void_kernel(void) {}");

  cppjit::void_kernel();
}